

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void flatview_insert(FlatView *view,uint pos,FlatRange *range)

{
  FlatRange *pFVar1;
  uint local_24;
  FlatRange *range_local;
  uint pos_local;
  FlatView *view_local;
  
  if (view->nr == view->nr_allocated) {
    if (view->nr << 1 < 0xb) {
      local_24 = 10;
    }
    else {
      local_24 = view->nr << 1;
    }
    view->nr_allocated = local_24;
    pFVar1 = (FlatRange *)g_realloc(view->ranges,(ulong)view->nr_allocated << 6);
    view->ranges = pFVar1;
  }
  memmove(view->ranges + (ulong)pos + 1,view->ranges + pos,(ulong)(view->nr - pos) << 6);
  memcpy(view->ranges + pos,range,0x40);
  view->nr = view->nr + 1;
  return;
}

Assistant:

static void flatview_insert(FlatView *view, unsigned pos, FlatRange *range)
{
    if (view->nr == view->nr_allocated) {
        view->nr_allocated = MAX(2 * view->nr, 10);
        view->ranges = g_realloc(view->ranges,
                                    view->nr_allocated * sizeof(*view->ranges));
    }
    memmove(view->ranges + pos + 1, view->ranges + pos,
            (view->nr - pos) * sizeof(FlatRange));
    view->ranges[pos] = *range;
    ++view->nr;
}